

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

int rd_bin_hdr(FILE *fp,uint32 *swap)

{
  int iVar1;
  int32 iVar2;
  char local_2148 [8];
  char value [8192];
  char attrib [256];
  char id [32];
  uint32 *swap_local;
  FILE *fp_local;
  
  iVar1 = __isoc99_fscanf(fp,"%31s",attrib + 0xf8);
  if (iVar1 == 1) {
    iVar1 = strcmp(attrib + 0xf8,"s3");
    if (iVar1 == 0) {
      s3clr_fattr();
      while( true ) {
        iVar1 = rd_attr_val(fp,value + 0x1ff8,local_2148);
        if (iVar1 == 0) break;
        s3add_fattr(value + 0x1ff8,local_2148,1);
      }
      iVar2 = swap_check(fp);
      if (iVar2 == -1) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                ,0xb1,"Error reading byte order magic number\n");
        fp_local._4_4_ = -1;
      }
      else {
        if (iVar2 == 0) {
          *swap = 0;
        }
        else {
          if (iVar2 != 1) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                    ,0xbb,"unexpected result from swap_check()\n");
            exit(1);
          }
          *swap = 1;
        }
        fp_local._4_4_ = 0;
      }
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
              ,0xa5,"No SPHINX-III file ID at beginning of file\n");
      fp_local._4_4_ = -1;
    }
  }
  else {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                   ,0x9e,"Unable to read the file ID");
    fp_local._4_4_ = -1;
  }
  return fp_local._4_4_;
}

Assistant:

static int
rd_bin_hdr(FILE *fp,
	   uint32 *swap)
{
    char id[32];
    char attrib[256];
    char value[8192];

    if (fscanf(fp, "%31s", id) != 1) {
	E_ERROR_SYSTEM("Unable to read the file ID");

	return S3_ERROR;
    }
    if (strcmp(id, "s3") == 0) {
    }
    else {
	E_ERROR("No SPHINX-III file ID at beginning of file\n");

	return S3_ERROR;
    }

    s3clr_fattr();
    while (rd_attr_val(fp, attrib, value)) {
	s3add_fattr(attrib, value, TRUE);
    }
    
    switch (swap_check(fp)) {
    case -1:
	E_ERROR("Error reading byte order magic number\n");

	return S3_ERROR;
    case 1:
	*swap = TRUE;
	break;
    case 0:
	*swap = FALSE;
	break;
    default:
	E_FATAL("unexpected result from swap_check()\n");
	break;
    }

    return S3_SUCCESS;
}